

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_ranged_critical(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  iVar2 = strcmp(__s1,"debuff-toh");
  if (iVar2 == 0) {
    *(wchar_t *)((long)pvVar3 + 200) = wVar1;
  }
  else {
    iVar2 = strcmp(__s1,"chance-weight-scale");
    if (iVar2 == 0) {
      *(wchar_t *)((long)pvVar3 + 0xcc) = wVar1;
    }
    else {
      iVar2 = strcmp(__s1,"chance-toh-scale");
      if (iVar2 == 0) {
        *(wchar_t *)((long)pvVar3 + 0xd0) = wVar1;
      }
      else {
        iVar2 = strcmp(__s1,"chance-level-scale");
        if (iVar2 == 0) {
          *(wchar_t *)((long)pvVar3 + 0xd4) = wVar1;
        }
        else {
          iVar2 = strcmp(__s1,"chance-launched-toh-skill-scale");
          if (iVar2 == 0) {
            *(wchar_t *)((long)pvVar3 + 0xd8) = wVar1;
          }
          else {
            iVar2 = strcmp(__s1,"chance-thrown-toh-skill-scale");
            if (iVar2 == 0) {
              *(wchar_t *)((long)pvVar3 + 0xdc) = wVar1;
            }
            else {
              iVar2 = strcmp(__s1,"chance-offset");
              if (iVar2 == 0) {
                *(wchar_t *)((long)pvVar3 + 0xe0) = wVar1;
              }
              else {
                iVar2 = strcmp(__s1,"chance-range");
                if (iVar2 == 0) {
                  *(wchar_t *)((long)pvVar3 + 0xe4) = wVar1;
                }
                else {
                  iVar2 = strcmp(__s1,"power-weight-scale");
                  if (iVar2 == 0) {
                    *(wchar_t *)((long)pvVar3 + 0xe8) = wVar1;
                  }
                  else {
                    iVar2 = strcmp(__s1,"power-random");
                    if (iVar2 != 0) {
                      return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                    }
                    *(wchar_t *)((long)pvVar3 + 0xec) = wVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_constants_ranged_critical(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	const char *label = parser_getsym(p, "label");
	int value = parser_getint(p, "value");

	if (streq(label, "debuff-toh")) {
		z->r_crit_debuff_toh = value;
	} else if (streq(label, "chance-weight-scale")) {
		z->r_crit_chance_weight_scl = value;
	} else if (streq(label, "chance-toh-scale")) {
		z->r_crit_chance_toh_scl = value;
	} else if (streq(label, "chance-level-scale")) {
		z->r_crit_chance_level_scl = value;
	} else if (streq(label, "chance-launched-toh-skill-scale")) {
		z->r_crit_chance_launched_toh_skill_scl = value;
	} else if (streq(label, "chance-thrown-toh-skill-scale")) {
		z->r_crit_chance_thrown_toh_skill_scl = value;
	} else if (streq(label, "chance-offset")) {
		z->r_crit_chance_offset = value;
	} else if (streq(label, "chance-range")) {
		z->r_crit_chance_range = value;
	} else if (streq(label, "power-weight-scale")) {
		z->r_crit_power_weight_scl = value;
	} else if (streq(label, "power-random")) {
		z->r_crit_power_random = value;
	} else {
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}
	return PARSE_ERROR_NONE;
}